

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O3

pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *
genPointPair<double>
          (pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
           *__return_storage_ptr__,Matrix<double,_4,_4,_0,_4,_4> *T)

{
  int iVar1;
  int iVar2;
  ActualDstType actualDst;
  undefined1 auVar3 [16];
  Matrix<double,_4,_1,_0,_4,_1> Q;
  Matrix<double,_4,_4,_0,_4,_4> *local_78;
  double *local_70;
  double local_68;
  double dStack_60;
  double local_58;
  Matrix<double,_4,_1,_0,_4,_1> local_48;
  
  iVar1 = rand();
  iVar2 = rand();
  auVar3._0_8_ = (double)iVar1 + (double)iVar1;
  auVar3._8_8_ = (double)iVar2 + (double)iVar2;
  auVar3 = divpd(auVar3,_DAT_00226040);
  local_68 = (auVar3._0_8_ + -1.0) * 40.0;
  dStack_60 = (auVar3._8_8_ + -1.0) * 40.0;
  iVar1 = rand();
  local_58 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * 40.0;
  local_78 = T;
  local_70 = &local_68;
  Eigen::internal::
  homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<double,3,1,0,3,1>,0>,Eigen::Matrix<double,4,4,0,4,4>>
  ::evalTo<Eigen::Matrix<double,4,1,0,4,1>>
            ((homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<double,3,1,0,3,1>,0>,Eigen::Matrix<double,4,4,0,4,4>>
              *)&local_78,&local_48);
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] = local_68;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] = dStack_60;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] = local_58;
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] = 1.0;
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] =
       local_48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [0];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] =
       local_48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [1];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] =
       local_48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [2];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] =
       local_48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [3];
  return __return_storage_ptr__;
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> genPointPair(Eigen::Matrix<floatPrec,4,4> T){
    
    // get a random 3D point (in homogenous coordinates)
    Eigen::Matrix<floatPrec,3,1> P = Eigen::Matrix<floatPrec, 3, 1>::Random(3) * int(POINTSWITHINCUBE);
    // requires as input the pose between the two 3D scans,
    // to apply the respective transformation to the
    // point in RefB
    
    Eigen::Matrix<floatPrec,4,1> Q = T * P.homogeneous();

    return std::make_pair(P.homogeneous(),Q);
}